

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlb_helper.c
# Opt level: O0

_Bool arm_cpu_tlb_fill_arm
                (CPUState *cs,vaddr address,int size,MMUAccessType access_type,int mmu_idx,
                _Bool probe,uintptr_t retaddr)

{
  MMUAccessType access_type_00;
  ulong uVar1;
  _Bool _Var2;
  ARMMMUIdx mmu_idx_00;
  CPUARMState *env;
  undefined1 local_74 [8];
  ARMMMUFaultInfo fi;
  MemTxAttrs attrs;
  int ret;
  int prot;
  target_ulong_conflict page_size;
  hwaddr phys_addr;
  ARMCPU *cpu;
  uc_struct_conflict1 *uc;
  MMUAccessType MStack_30;
  _Bool probe_local;
  int mmu_idx_local;
  MMUAccessType access_type_local;
  int size_local;
  vaddr address_local;
  CPUState *cs_local;
  
  cpu = (ARMCPU *)cs->uc;
  fi.domain = 0;
  phys_addr = (hwaddr)cs;
  uc._3_1_ = probe;
  uc._4_4_ = mmu_idx;
  MStack_30 = access_type;
  mmu_idx_local = size;
  _access_type_local = address;
  address_local = (vaddr)cs;
  memset(local_74,0,0x14);
  uVar1 = _access_type_local;
  access_type_00 = MStack_30;
  env = (CPUARMState *)(phys_addr + 0xa2f0);
  mmu_idx_00 = core_to_arm_mmu_idx((CPUARMState *)(phys_addr + 0xa2f0),uc._4_4_);
  _Var2 = get_phys_addr_arm(env,uVar1 & 0xffffffff,access_type_00,mmu_idx_00,(hwaddr *)&prot,
                            (MemTxAttrs *)&fi.domain,(int *)&attrs,(target_ulong *)&ret,
                            (ARMMMUFaultInfo_conflict *)local_74,(ARMCacheAttrs *)0x0);
  fi._16_4_ = ZEXT14(_Var2);
  if (fi._16_4_ == 0) {
    if ((uint)-(int)(cpu->parent_obj).tb_jmp_cache[0x2b]->cs_base <= (uint)ret) {
      _prot = (long)(int)(cpu->parent_obj).tb_jmp_cache[0x2b]->cs_base & _prot;
      _access_type_local =
           (long)(int)(cpu->parent_obj).tb_jmp_cache[0x2b]->cs_base & _access_type_local;
    }
    tlb_set_page_with_attrs_arm
              ((CPUState *)address_local,(target_ulong_conflict)_access_type_local,_prot,
               (MemTxAttrs)fi.domain,(int)attrs,uc._4_4_,ret);
    cs_local._7_1_ = true;
  }
  else {
    if ((uc._3_1_ & 1) == 0) {
      cpu_restore_state_arm((CPUState *)address_local,retaddr,true);
      arm_deliver_fault((ARMCPU *)phys_addr,_access_type_local,MStack_30,uc._4_4_,
                        (ARMMMUFaultInfo *)local_74);
    }
    cs_local._7_1_ = false;
  }
  return cs_local._7_1_;
}

Assistant:

bool arm_cpu_tlb_fill(CPUState *cs, vaddr address, int size,
                      MMUAccessType access_type, int mmu_idx,
                      bool probe, uintptr_t retaddr)
{
    struct uc_struct *uc = cs->uc;
    ARMCPU *cpu = ARM_CPU(cs);

    hwaddr phys_addr;
    target_ulong page_size;
    int prot, ret;
    MemTxAttrs attrs = { 0 };
    ARMMMUFaultInfo fi = { 0 };

    /*
     * Walk the page table and (if the mapping exists) add the page
     * to the TLB.  On success, return true.  Otherwise, if probing,
     * return false.  Otherwise populate fsr with ARM DFSR/IFSR fault
     * register format, and signal the fault.
     */
    ret = get_phys_addr(&cpu->env, address, access_type,
                        core_to_arm_mmu_idx(&cpu->env, mmu_idx),
                        &phys_addr, &attrs, &prot, &page_size, &fi, NULL);
    if (likely(!ret)) {
        /*
         * Map a single [sub]page. Regions smaller than our declared
         * target page size are handled specially, so for those we
         * pass in the exact addresses.
         */
        if (page_size >= TARGET_PAGE_SIZE) {
            phys_addr &= TARGET_PAGE_MASK;
            address &= TARGET_PAGE_MASK;
        }
        tlb_set_page_with_attrs(cs, address, phys_addr, attrs,
                                prot, mmu_idx, page_size);
        return true;
    } else if (probe) {
        return false;
    } else {
        /* now we have a real cpu fault */
        cpu_restore_state(cs, retaddr, true);
        arm_deliver_fault(cpu, address, access_type, mmu_idx, &fi);
    }
}